

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  locale *plVar4;
  basic_format_specs<char> *pbVar5;
  undefined1 auVar6 [16];
  int iVar7;
  char cVar8;
  uint uVar9;
  numpunct *pnVar10;
  ulong uVar12;
  buffer_appender<char> bVar13;
  int iVar14;
  buffer<char> *buf;
  uint uVar15;
  long *plVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_298;
  long local_290;
  long local_288;
  char acStack_27a [50];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong uVar11;
  
  plVar4 = (locale *)(this->locale).locale_;
  if (plVar4 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar4);
  }
  pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar10 + 0x20))(&local_298,pnVar10);
  std::locale::~locale((locale *)&local_248);
  if (local_290 == 0) {
    on_dec(this);
  }
  else {
    plVar4 = (locale *)(this->locale).locale_;
    if (plVar4 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar4);
    }
    pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar10 + 0x18))(pnVar10);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 != '\0') {
      puVar1 = &this->abs_value;
      uVar24 = (ulong)*puVar1;
      uVar12 = *(ulong *)((long)&this->abs_value + 8);
      auVar6 = (undefined1  [16])*puVar1;
      auVar26 = (undefined1  [16])*puVar1;
      uVar23 = 1;
      if ((uVar24 < 10) <= uVar12) {
        uVar23 = 4;
        auVar25 = auVar26;
        do {
          uVar20 = auVar25._8_8_;
          uVar11 = auVar25._0_8_;
          iVar18 = (int)uVar23;
          if (uVar20 == 0 && (ulong)(99 < uVar11) <= -uVar20) {
            uVar23 = (ulong)(iVar18 - 2);
            goto LAB_00127354;
          }
          if (uVar20 == 0 && (ulong)(999 < uVar11) <= -uVar20) {
            uVar23 = (ulong)(iVar18 - 1);
            goto LAB_00127354;
          }
          if (uVar20 < (uVar11 < 10000)) goto LAB_00127354;
          auVar25 = __udivti3(uVar11,uVar20,10000,0);
          uVar23 = (ulong)(iVar18 + 4);
        } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar11));
        uVar23 = (ulong)(iVar18 + 1);
      }
LAB_00127354:
      uVar22 = (uint)uVar23;
      uVar9 = uVar22;
      uVar15 = uVar22;
      if (local_290 != 0) {
        uVar15 = uVar22 + (int)local_290;
        lVar19 = 0;
        uVar11 = uVar23;
        do {
          cVar3 = *(char *)((long)local_298 + lVar19);
          iVar18 = (int)uVar11;
          uVar9 = iVar18 - cVar3;
          uVar11 = (ulong)uVar9;
          if ((uVar9 == 0 || iVar18 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) {
            iVar18 = (int)lVar19 + uVar22;
            goto LAB_001273a3;
          }
          lVar19 = lVar19 + 1;
        } while (local_290 != lVar19);
      }
      iVar18 = (int)(uVar9 - 1) / (int)*(char *)((long)local_298 + local_290 + -1) + uVar15;
LAB_001273a3:
      iVar14 = 1;
      if ((uVar24 < 10) <= uVar12) {
        iVar7 = 4;
        auVar25 = auVar26;
        do {
          iVar14 = iVar7;
          uVar20 = auVar25._8_8_;
          uVar11 = auVar25._0_8_;
          if (uVar20 == 0 && (ulong)(99 < uVar11) <= -uVar20) {
            iVar14 = iVar14 + -2;
            goto LAB_00127437;
          }
          if (uVar20 == 0 && (ulong)(999 < uVar11) <= -uVar20) {
            iVar14 = iVar14 + -1;
            goto LAB_00127437;
          }
          if (uVar20 < (uVar11 < 10000)) goto LAB_00127437;
          auVar25 = __udivti3(uVar11,uVar20,10000,0);
          iVar7 = iVar14 + 4;
        } while (uVar20 != 0 || -uVar20 < (ulong)(99999 < uVar11));
        iVar14 = iVar14 + 1;
      }
LAB_00127437:
      if ((int)uVar22 < iVar14) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
                    ,0x41b,"invalid digit count");
      }
      pcVar17 = acStack_27a + (long)(int)uVar22 + 2;
      pcVar21 = pcVar17;
      if ((uVar24 < 100) <= uVar12) {
        do {
          lVar19 = auVar26._8_8_;
          uVar24 = auVar26._0_8_;
          pcVar17 = pcVar21 + -2;
          auVar26 = __udivti3(uVar24,lVar19,100,0);
          *(undefined2 *)(pcVar21 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar24 + auVar26._0_8_ * -100) * 2);
          pcVar21 = pcVar17;
          auVar6 = auVar26;
        } while (lVar19 != 0 || (ulong)-lVar19 < (ulong)(9999 < uVar24));
      }
      if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
        pcVar17[-1] = auVar6[0] | 0x30;
      }
      else {
        *(undefined2 *)(pcVar17 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar6._0_8_ * 2)
        ;
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00792970;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar9 = iVar18 + this->prefix_size;
      if (-1 < (int)uVar9) {
        uVar24 = (ulong)uVar9;
        if (500 < uVar9) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar24);
        }
        pcVar21 = local_248.super_buffer<char>.ptr_;
        pcVar17 = local_248.super_buffer<char>.ptr_ + (uVar24 - 1);
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar24 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar24;
        }
        if (1 < (int)uVar22) {
          uVar23 = uVar23 + 1;
          iVar18 = 0;
          plVar16 = local_298;
          do {
            pcVar2 = pcVar17 + -1;
            *pcVar17 = acStack_27a[uVar23];
            cVar3 = (char)*plVar16;
            if ('\0' < cVar3) {
              iVar18 = iVar18 + 1;
              if ((cVar3 != '\x7f') && (iVar18 % (int)cVar3 == 0)) {
                pcVar17[-1] = cVar8;
                if ((long *)((long)plVar16 + 1) != (long *)((long)local_298 + local_290)) {
                  iVar18 = 0;
                  plVar16 = (long *)((long)plVar16 + 1);
                }
                pcVar2 = pcVar17 + -2;
              }
            }
            pcVar17 = pcVar2;
            uVar23 = uVar23 - 1;
          } while (2 < uVar23);
        }
        *pcVar17 = acStack_27a[2];
        if (this->prefix_size != 0) {
          pcVar17[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar12 = (ulong)pbVar5->width;
        if (-1 < (long)uVar12) {
          bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          uVar23 = 0;
          if (uVar24 <= uVar12) {
            uVar23 = uVar12 - uVar24;
          }
          cVar8 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          if (*(ulong *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar24 + (pbVar5->fill).size_ * uVar23) {
            (*(code *)**(undefined8 **)
                        bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar12 = uVar23 >> ((long)cVar8 & 0x3fU);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar13,uVar12,&pbVar5->fill);
          bVar13 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar21,pcVar21 + uVar24,bVar13);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar13,uVar23 - uVar12,&pbVar5->fill);
          (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_00127688;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_00127688:
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }